

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O1

void __thiscall FailableMemoryAllocator::failAllocNumber(FailableMemoryAllocator *this,int number)

{
  LocationToFailAllocNode *pLVar1;
  int iVar2;
  undefined4 extraout_var;
  LocationToFailAllocNode *pLVar3;
  
  iVar2 = (*(this->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[8])(this,0x20);
  pLVar3 = (LocationToFailAllocNode *)CONCAT44(extraout_var,iVar2);
  pLVar1 = this->head_;
  pLVar3->allocNumberToFail_ = 0;
  pLVar3->actualAllocNumber_ = 0;
  pLVar3->file_ = (char *)0x0;
  pLVar3->line_ = 0;
  pLVar3->next_ = pLVar1;
  pLVar3->allocNumberToFail_ = number;
  this->head_ = pLVar3;
  return;
}

Assistant:

void FailableMemoryAllocator::failAllocNumber(int number)
{
    LocationToFailAllocNode* newNode = (LocationToFailAllocNode*) (void*) allocMemoryLeakNode(sizeof(LocationToFailAllocNode));
    newNode->failAtAllocNumber(number, head_);
    head_ = newNode;
}